

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Data>
          (PointerBuilder *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  uint defaultSize_00;
  ArrayPtr<unsigned_char> AVar1;
  ThrowOverflow local_2d;
  ByteCount local_2c;
  void *pvStack_28;
  ByteCount defaultSize_local;
  void *defaultValue_local;
  PointerBuilder *this_local;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  local_2c = defaultSize;
  pvStack_28 = defaultValue;
  defaultValue_local = this;
  defaultSize_00 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_2d);
  AVar1 = (ArrayPtr<unsigned_char>)
          WireHelpers::getWritableDataPointer(ref,segment,capTable,defaultValue,defaultSize_00);
  return (Builder)AVar1;
}

Assistant:

Data::Builder PointerBuilder::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableDataPointer(pointer, segment, capTable, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}